

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_scope.c
# Opt level: O0

value scope_metadata_name(scope sp)

{
  value *ppvVar1;
  value pvVar2;
  size_t *in_RDI;
  value v;
  value *v_ptr;
  value in_stack_00000050;
  size_t in_stack_ffffffffffffffd8;
  size_t length;
  value *in_stack_ffffffffffffffe0;
  char *local_8;
  
  local_8 = (char *)value_create_array(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (local_8 == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    ppvVar1 = value_to_array((value)0x10d1ec);
    pvVar2 = value_create_string(local_8,in_stack_ffffffffffffffd8);
    *ppvVar1 = pvVar2;
    if (*ppvVar1 == (value)0x0) {
      value_type_destroy(in_stack_00000050);
    }
    length = *in_RDI;
    strlen((char *)*in_RDI);
    pvVar2 = value_create_string(local_8,length);
    ppvVar1[1] = pvVar2;
    if (ppvVar1[1] == (value)0x0) {
      value_type_destroy(in_stack_00000050);
    }
  }
  return local_8;
}

Assistant:

value scope_metadata_name(scope sp)
{
	static const char name[] = "name";

	value *v_ptr, v = value_create_array(NULL, 2);

	if (v == NULL)
	{
		return NULL;
	}

	v_ptr = value_to_array(v);

	v_ptr[0] = value_create_string(name, sizeof(name) - 1);

	if (v_ptr[0] == NULL)
	{
		value_type_destroy(v);
	}

	v_ptr[1] = value_create_string(sp->name, strlen(sp->name));

	if (v_ptr[1] == NULL)
	{
		value_type_destroy(v);
	}

	return v;
}